

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_write_nonblock.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  uint __i;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream_00;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 uVar9;
  time_t tVar10;
  long lVar11;
  ulong uVar12;
  time_t tVar13;
  fd_set *__writefds;
  fd_set *__readfds;
  char *pcVar14;
  long lVar15;
  size_t sStack_19120;
  long lStack_19100;
  int iStack_190f0;
  timeval timeout;
  sockaddr_in sin;
  fd_set fd;
  char mem [102400];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((password = argv[3], argc != 4 && (loclfile = argv[4], 5 < (uint)argc)))) {
      sftppath = argv[5];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 == 0) {
    __stream_00 = fopen(loclfile,"rb");
    if (__stream_00 != (FILE *)0x0) {
      __fd = socket(2,1,0);
      if (__fd == -1) {
        pcVar14 = "failed to create socket.\n";
        sStack_19120 = 0x19;
      }
      else {
        sin.sin_family = 2;
        sin.sin_port = 0x1600;
        sin.sin_addr.s_addr = iVar2;
        iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
        if (iVar4 == 0) {
          lVar5 = libssh2_session_init_ex(0,0,0,0);
          if (lVar5 != 0) {
            libssh2_session_set_blocking(lVar5,0);
            do {
              uVar3 = libssh2_session_handshake(lVar5,__fd);
            } while (uVar3 == 0xffffffdb);
            if (uVar3 == 0) {
              lVar6 = libssh2_hostkey_hash(lVar5,2);
              fwrite("Fingerprint: ",0xd,1,_stderr);
              for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
                fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar15));
              }
              fputc(10,_stderr);
              do {
                pcVar14 = username;
                sVar7 = strlen(username);
                pcVar1 = password;
                sVar8 = strlen(password);
                iVar4 = libssh2_userauth_password_ex
                                  (lVar5,pcVar14,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
              } while (iVar4 == -0x25);
              if (iVar4 == 0) {
                fwrite("libssh2_sftp_init().\n",0x15,1,_stderr);
                do {
                  lVar6 = libssh2_sftp_init(lVar5);
                  if (lVar6 != 0) {
                    fwrite("libssh2_sftp_open().\n",0x15,1,_stderr);
                    goto LAB_00101683;
                  }
                  iVar4 = libssh2_session_last_errno(lVar5);
                } while (iVar4 == -0x25);
                fwrite("Unable to init SFTP session\n",0x1c,1,_stderr);
              }
              else {
                fwrite("Authentication by password failed.\n",0x23,1,_stderr);
              }
            }
            else {
              fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
            }
            goto LAB_0010147e;
          }
          pcVar14 = "Could not initialize SSH session.\n";
          sStack_19120 = 0x22;
        }
        else {
          pcVar14 = "failed to connect.\n";
          sStack_19120 = 0x13;
        }
      }
      fwrite(pcVar14,sStack_19120,1,_stderr);
      lVar5 = 0;
      goto LAB_0010147e;
    }
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
  }
  return 1;
  while (iVar4 = libssh2_session_last_errno(lVar5), __stream = _stderr, iVar4 == -0x25) {
LAB_00101683:
    pcVar14 = sftppath;
    sVar7 = strlen(sftppath);
    lVar15 = libssh2_sftp_open_ex(lVar6,pcVar14,sVar7 & 0xffffffff,0x1a,0x1a4,0);
    if (lVar15 != 0) {
      fwrite("libssh2_sftp_open() is done, now send data.\n",0x2c,1,_stderr);
      tVar10 = time((time_t *)0x0);
      lStack_19100 = 0;
      goto LAB_00101746;
    }
  }
  uVar9 = libssh2_sftp_last_error(lVar6);
  fprintf(__stream,"Unable to open file with SFTP: %ld\n",uVar9);
  goto LAB_0010147e;
LAB_00101746:
  do {
    sVar7 = fread(mem,1,0x19000,__stream_00);
    if (sVar7 == 0) break;
    pcVar14 = mem;
    sVar8 = sVar7;
    do {
      while (lVar11 = libssh2_sftp_write(lVar15,pcVar14,sVar8), lVar11 == -0x25) {
        timeout.tv_sec = 10;
        timeout.tv_usec = 0;
        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
          fd.__fds_bits[lVar11] = 0;
        }
        fd.__fds_bits[__fd / 0x40] = fd.__fds_bits[__fd / 0x40] | 1L << ((byte)__fd & 0x3f);
        uVar12 = libssh2_session_block_directions(lVar5);
        __readfds = &fd;
        if ((uVar12 & 1) == 0) {
          __readfds = (fd_set *)0x0;
        }
        __writefds = &fd;
        if ((uVar12 & 2) == 0) {
          __writefds = (fd_set *)0x0;
        }
        select(__fd + 1,(fd_set *)__readfds,(fd_set *)__writefds,(fd_set *)0x0,(timeval *)&timeout);
      }
      if (lVar11 < 0) break;
      pcVar14 = pcVar14 + lVar11;
      sVar8 = sVar8 - lVar11;
    } while (sVar8 != 0);
    lStack_19100 = lStack_19100 + sVar7;
  } while (0 < lVar11);
  tVar13 = time((time_t *)0x0);
  iStack_190f0 = (int)tVar10;
  uVar3 = (int)tVar13 - iStack_190f0;
  fprintf(_stderr,"%ld bytes in %d seconds makes %.1f bytes/sec\n",
          (double)lStack_19100 / (double)(int)uVar3,lStack_19100,(ulong)uVar3);
  libssh2_sftp_close_handle(lVar15);
  libssh2_sftp_shutdown(lVar6);
LAB_0010147e:
  fclose(__stream_00);
  if (lVar5 != 0) {
    do {
      iVar4 = libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    } while (iVar4 == -0x25);
    libssh2_session_free(lVar5);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    ssize_t nwritten;
    char *ptr;
    time_t start;
    libssh2_struct_stat_size total = 0;
    int duration;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        sftppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init().\n");
    do {
        sftp_session = libssh2_sftp_init(session);

        if(!sftp_session &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to init SFTP session\n");
            goto shutdown;
        }
    } while(!sftp_session);

    fprintf(stderr, "libssh2_sftp_open().\n");
    /* Request a file via SFTP */
    do {
        sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                        LIBSSH2_FXF_WRITE |
                                        LIBSSH2_FXF_CREAT |
                                        LIBSSH2_FXF_TRUNC,
                                        LIBSSH2_SFTP_S_IRUSR |
                                        LIBSSH2_SFTP_S_IWUSR |
                                        LIBSSH2_SFTP_S_IRGRP |
                                        LIBSSH2_SFTP_S_IROTH);
        if(!sftp_handle &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                    libssh2_sftp_last_error(sftp_session));
            goto shutdown;
        }
    } while(!sftp_handle);

    fprintf(stderr, "libssh2_sftp_open() is done, now send data.\n");
    start = time(NULL);
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        total += (libssh2_struct_stat_size)nread;

        do {
            /* write data in a loop until we block */
            while((nwritten = libssh2_sftp_write(sftp_handle, ptr, nread)) ==
                  LIBSSH2_ERROR_EAGAIN) {
                waitsocket(sock, session);
            }
            if(nwritten < 0)
                break;
            ptr += nwritten;
            nread -= (size_t)nwritten;
        } while(nread);
    } while(nwritten > 0);

    duration = (int)(time(NULL) - start);

    fprintf(stderr, "%ld bytes in %d seconds makes %.1f bytes/sec\n",
            (long)total, duration, (double)total / duration);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    fclose(local);

    if(session) {
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}